

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::MacOSXRpathInstallNameDirDefault(cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  allocator local_39;
  string local_38;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&local_38,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG",&local_39);
  bVar1 = cmMakefile::IsSet(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_38,"MACOSX_RPATH",&local_39);
    pcVar3 = GetProperty(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (pcVar3 == (char *)0x0) {
      PVar2 = GetPolicyStatusCMP0042(this);
      if (PVar2 == WARN) {
        cmGlobalGenerator::AddCMP0042WarnTarget
                  (this->LocalGenerator->GlobalGenerator,&this->Target->Name);
      }
      bVar1 = PVar2 == NEW;
    }
    else {
      std::__cxx11::string::string((string *)&local_38,"MACOSX_RPATH",&local_39);
      bVar1 = GetPropertyAsBool(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::MacOSXRpathInstallNameDirDefault() const
{
  // we can't do rpaths when unsupported
  if(!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG"))
    {
    return false;
    }

  const char* macosx_rpath_str = this->GetProperty("MACOSX_RPATH");
  if(macosx_rpath_str)
    {
    return this->GetPropertyAsBool("MACOSX_RPATH");
    }

  cmPolicies::PolicyStatus cmp0042 = this->GetPolicyStatusCMP0042();

  if(cmp0042 == cmPolicies::WARN)
    {
    this->LocalGenerator->GetGlobalGenerator()->
      AddCMP0042WarnTarget(this->GetName());
    }

  if(cmp0042 == cmPolicies::NEW)
    {
    return true;
    }

  return false;
}